

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicGraph.cpp
# Opt level: O0

void __thiscall
DynamicGraph::rollBack
          (DynamicGraph *this,
          list<std::unique_ptr<Action,_std::default_delete<Action>_>,_std::allocator<std::unique_ptr<Action,_std::default_delete<Action>_>_>_>
          *actions,list<unsigned_long,_std::allocator<unsigned_long>_> *incVertices)

{
  size_type __n;
  bool bVar1;
  reference this_00;
  type pAVar2;
  reference pvVar3;
  reference pvVar4;
  Vertex v;
  unique_ptr<Action,_std::default_delete<Action>_> *action;
  iterator __end1;
  iterator __begin1;
  list<std::unique_ptr<Action,_std::default_delete<Action>_>,_std::allocator<std::unique_ptr<Action,_std::default_delete<Action>_>_>_>
  *__range1;
  list<unsigned_long,_std::allocator<unsigned_long>_> *incVertices_local;
  list<std::unique_ptr<Action,_std::default_delete<Action>_>,_std::allocator<std::unique_ptr<Action,_std::default_delete<Action>_>_>_>
  *actions_local;
  DynamicGraph *this_local;
  
  __end1 = std::__cxx11::
           list<std::unique_ptr<Action,_std::default_delete<Action>_>,_std::allocator<std::unique_ptr<Action,_std::default_delete<Action>_>_>_>
           ::begin(actions);
  action = (unique_ptr<Action,_std::default_delete<Action>_> *)
           std::__cxx11::
           list<std::unique_ptr<Action,_std::default_delete<Action>_>,_std::allocator<std::unique_ptr<Action,_std::default_delete<Action>_>_>_>
           ::end(actions);
  while (bVar1 = std::operator!=(&__end1,(_Self *)&action), bVar1) {
    this_00 = std::_List_iterator<std::unique_ptr<Action,_std::default_delete<Action>_>_>::operator*
                        (&__end1);
    pAVar2 = std::unique_ptr<Action,_std::default_delete<Action>_>::operator*(this_00);
    (**pAVar2->_vptr_Action)();
    std::_List_iterator<std::unique_ptr<Action,_std::default_delete<Action>_>_>::operator++(&__end1)
    ;
  }
  while (bVar1 = std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>::empty
                           (incVertices), ((bVar1 ^ 0xffU) & 1) != 0) {
    pvVar3 = std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>::front(incVertices);
    __n = *pvVar3;
    std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>::pop_front(incVertices);
    pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       (&this->level,__n);
    *pvVar4 = *pvVar4 - 1;
  }
  return;
}

Assistant:

void DynamicGraph::rollBack(std::list<std::unique_ptr<Action>> &actions, std::list<Vertex>& incVertices)
{
    for (auto &action : actions) {
        (*action).undo();
    }

    while(!incVertices.empty()) {
        Vertex v = incVertices.front();
        incVertices.pop_front();
        this->level[v]--;
    }
}